

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

floatx80 floatx80_round_to_int_sparc(floatx80 a,float_status *status)

{
  unkuint10 Var1;
  _Bool _Var2;
  flag fVar3;
  int32_t iVar4;
  uint64_t uVar5;
  ulong uVar6;
  ulong uVar7;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar8;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  ulong uVar9;
  floatx80 b;
  floatx80 a_00;
  floatx80 a_01;
  floatx80 a_02;
  floatx80 a_03;
  floatx80 a_04;
  floatx80 a_05;
  floatx80 a_06;
  floatx80 a_07;
  floatx80 a_08;
  floatx80 fVar10;
  floatx80 fVar11;
  ulong uStack_58;
  floatx80 z;
  uint64_t roundBitsMask;
  uint64_t lastBitMask;
  int32_t aExp;
  flag aSign;
  float_status *status_local;
  floatx80 a_local;
  
  uVar9 = a.low;
  z.low._0_2_ = a.high;
  Var1 = a._0_10_;
  a_00._10_6_ = 0;
  a_00.low = (long)Var1;
  a_00.high = (short)(Var1 >> 0x40);
  _Var2 = floatx80_invalid_encoding(a_00);
  if (_Var2) {
    float_raise_sparc('\x01',status);
    fVar10 = floatx80_default_nan_sparc(status);
    z.low._0_2_ = fVar10.high;
    goto LAB_00d93524;
  }
  a_01._10_6_ = 0;
  a_01.low = (long)Var1;
  a_01.high = (short)(Var1 >> 0x40);
  iVar4 = extractFloatx80Exp(a_01);
  if (0x403d < iVar4) {
    uVar8 = extraout_RDX;
    if ((iVar4 == 0x7fff) &&
       (a_02._10_6_ = 0, a_02.low = (long)Var1, a_02.high = (short)(Var1 >> 0x40),
       uVar5 = extractFloatx80Frac(a_02), uVar8 = extraout_RDX_00, (uVar5 & 0x7fffffffffffffff) != 0
       )) {
      b._10_6_ = 0;
      b.low = (long)Var1;
      b.high = (short)(Var1 >> 0x40);
      a_03._10_6_ = 0;
      a_03.low = (long)Var1;
      a_03.high = (short)(Var1 >> 0x40);
      fVar10 = propagateFloatx80NaN_sparc(a_03,b,status);
      z.low._0_2_ = fVar10.high;
    }
    else {
      fVar10._8_8_ = uVar8;
      fVar10.low = uVar9;
    }
    goto LAB_00d93524;
  }
  if (0x3ffe < iVar4) {
    lastBitMask._0_1_ = (char)iVar4;
    uVar8 = CONCAT71((int7)((ulong)extraout_RDX >> 8),(char)lastBitMask);
    uVar6 = 1L << (0x3eU - (char)lastBitMask & 0x3f);
    uVar7 = uVar6 - 1;
    uStack_58 = uVar9;
    switch(status->float_rounding_mode) {
    case '\0':
      uStack_58 = (uVar6 >> 1) + uVar9;
      if ((uStack_58 & uVar7) == 0) {
        uStack_58 = (uVar6 ^ 0xffffffffffffffff) & uStack_58;
      }
      break;
    case '\x01':
      a_08._10_6_ = 0;
      a_08.low = (long)Var1;
      a_08.high = (short)(Var1 >> 0x40);
      fVar3 = extractFloatx80Sign(a_08);
      uVar8 = extraout_RDX_03;
      if (fVar3 != '\0') {
        uStack_58 = uVar7 + uVar9;
      }
      break;
    case '\x02':
      a_07._10_6_ = 0;
      a_07.low = (long)Var1;
      a_07.high = (short)(Var1 >> 0x40);
      fVar3 = extractFloatx80Sign(a_07);
      uVar8 = extraout_RDX_02;
      if (fVar3 == '\0') {
        uStack_58 = uVar7 + uVar9;
      }
      break;
    case '\x03':
      break;
    case '\x04':
      uStack_58 = (uVar6 >> 1) + uVar9;
      break;
    default:
      abort();
    }
    uStack_58 = (uVar7 ^ 0xffffffffffffffff) & uStack_58;
    if (uStack_58 == 0) {
      z.low._0_2_ = (uint16_t)z.low + 1;
      uStack_58 = 0x8000000000000000;
    }
    if (uStack_58 != uVar9) {
      status->float_exception_flags = status->float_exception_flags | 0x20;
    }
    fVar10._8_8_ = uVar8;
    fVar10.low = uStack_58;
    goto LAB_00d93524;
  }
  if ((iVar4 == 0) &&
     (a_04._10_6_ = 0, a_04.low = (long)Var1, a_04.high = (short)(Var1 >> 0x40),
     uVar5 = extractFloatx80Frac(a_04), (uVar5 & 0x7fffffffffffffff) == 0)) {
    fVar10._8_8_ = extraout_RDX_01;
    fVar10.low = uVar9;
    goto LAB_00d93524;
  }
  status->float_exception_flags = status->float_exception_flags | 0x20;
  a_05._10_2_ = a_local.low._2_2_;
  a_05.low = (long)Var1;
  a_05.high = (short)(Var1 >> 0x40);
  a_05._12_4_ = 0;
  fVar3 = extractFloatx80Sign(a_05);
  switch(status->float_rounding_mode) {
  case '\0':
    if ((iVar4 == 0x3ffe) &&
       (a_06._10_6_ = 0, a_06.low = (long)Var1, a_06.high = (short)(Var1 >> 0x40),
       uVar5 = extractFloatx80Frac(a_06), (uVar5 & 0x7fffffffffffffff) != 0)) {
      fVar10 = packFloatx80(fVar3,0x3fff,0x8000000000000000);
      z.low._0_2_ = fVar10.high;
      goto LAB_00d93524;
    }
    break;
  case '\x01':
    if (fVar3 == '\0') {
      fVar10 = packFloatx80('\0',0,0);
      z.low._0_2_ = fVar10.high;
    }
    else {
      fVar10 = packFloatx80('\x01',0x3fff,0x8000000000000000);
      z.low._0_2_ = fVar10.high;
    }
    goto LAB_00d93524;
  case '\x02':
    if (fVar3 == '\0') {
      fVar10 = packFloatx80('\0',0x3fff,0x8000000000000000);
      z.low._0_2_ = fVar10.high;
    }
    else {
      fVar10 = packFloatx80('\x01',0,0);
      z.low._0_2_ = fVar10.high;
    }
    goto LAB_00d93524;
  case '\x04':
    if (iVar4 == 0x3ffe) {
      fVar10 = packFloatx80(fVar3,0x3fff,0x8000000000000000);
      z.low._0_2_ = fVar10.high;
      goto LAB_00d93524;
    }
  }
  fVar10 = packFloatx80(fVar3,0,0);
  z.low._0_2_ = fVar10.high;
LAB_00d93524:
  a_local._8_8_ = fVar10.low;
  fVar11._10_6_ = fVar10._10_6_;
  fVar11.high = (uint16_t)z.low;
  fVar11.low = a_local._8_8_;
  return fVar11;
}

Assistant:

floatx80 floatx80_round_to_int(floatx80 a, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t lastBitMask, roundBitsMask;
    floatx80 z;

    if (floatx80_invalid_encoding(a)) {
        float_raise(float_flag_invalid, status);
        return floatx80_default_nan(status);
    }
    aExp = extractFloatx80Exp( a );
    if ( 0x403E <= aExp ) {
        if ( ( aExp == 0x7FFF ) && (uint64_t) ( extractFloatx80Frac( a )<<1 ) ) {
            return propagateFloatx80NaN(a, a, status);
        }
        return a;
    }
    if ( aExp < 0x3FFF ) {
        if (    ( aExp == 0 )
             && ( (uint64_t) ( extractFloatx80Frac( a )<<1 ) == 0 ) ) {
            return a;
        }
        status->float_exception_flags |= float_flag_inexact;
        aSign = extractFloatx80Sign( a );
        switch (status->float_rounding_mode) {
         case float_round_nearest_even:
            if ( ( aExp == 0x3FFE ) && (uint64_t) ( extractFloatx80Frac( a )<<1 )
               ) {
                return
                    packFloatx80( aSign, 0x3FFF, UINT64_C(0x8000000000000000));
            }
            break;
        case float_round_ties_away:
            if (aExp == 0x3FFE) {
                return packFloatx80(aSign, 0x3FFF, UINT64_C(0x8000000000000000));
            }
            break;
         case float_round_down:
            return
                  aSign ?
                      packFloatx80( 1, 0x3FFF, UINT64_C(0x8000000000000000))
                : packFloatx80( 0, 0, 0 );
         case float_round_up:
            return
                  aSign ? packFloatx80( 1, 0, 0 )
                : packFloatx80( 0, 0x3FFF, UINT64_C(0x8000000000000000));
        }
        return packFloatx80( aSign, 0, 0 );
    }
    lastBitMask = 1;
    lastBitMask <<= 0x403E - aExp;
    roundBitsMask = lastBitMask - 1;
    z = a;
    switch (status->float_rounding_mode) {
    case float_round_nearest_even:
        z.low += lastBitMask>>1;
        if ((z.low & roundBitsMask) == 0) {
            z.low &= ~lastBitMask;
        }
        break;
    case float_round_ties_away:
        z.low += lastBitMask >> 1;
        break;
    case float_round_to_zero:
        break;
    case float_round_up:
        if (!extractFloatx80Sign(z)) {
            z.low += roundBitsMask;
        }
        break;
    case float_round_down:
        if (extractFloatx80Sign(z)) {
            z.low += roundBitsMask;
        }
        break;
    default:
        abort();
    }
    z.low &= ~ roundBitsMask;
    if ( z.low == 0 ) {
        ++z.high;
        z.low = UINT64_C(0x8000000000000000);
    }
    if (z.low != a.low) {
        status->float_exception_flags |= float_flag_inexact;
    }
    return z;

}